

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

void __thiscall TaskProvider::TaskProvider(TaskProvider *this,ThreadPool *pool)

{
  AbstractTaskProvider::AbstractTaskProvider(&this->super_AbstractTaskProvider);
  (this->super_AbstractTaskProvider)._vptr_AbstractTaskProvider =
       (_func_int **)&PTR__TaskProvider_0012ec70;
  this->_threadPool = pool;
  return;
}

Assistant:

TaskProvider::TaskProvider( ThreadPool * pool )
    : _threadPool ( pool )
{
}